

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miner.cpp
# Opt level: O2

void __thiscall xmrig::Miner::Miner(Miner *this,Controller *controller)

{
  MinerPrivate *pMVar1;
  Api *this_00;
  Timer *this_01;
  OclBackend *pOVar2;
  OclBackend *local_30;
  
  (this->super_ITimerListener)._vptr_ITimerListener = (_func_int **)&PTR__Miner_001bc660;
  (this->super_IBaseListener)._vptr_IBaseListener = (_func_int **)&PTR__Miner_001bc698;
  (this->super_IApiListener)._vptr_IApiListener = (_func_int **)&PTR__Miner_001bc6c0;
  pMVar1 = (MinerPrivate *)operator_new(0x158);
  pMVar1->active = false;
  pMVar1->enabled = true;
  pMVar1->reset = true;
  pMVar1->controller = controller;
  (pMVar1->job).m_extraIters = 0;
  (pMVar1->job).m_seed.m_data = (char *)0x0;
  (pMVar1->job).m_seed.m_size = 0;
  (pMVar1->job).m_size = 0;
  (pMVar1->job).m_clientId.m_data = (char *)0x0;
  (pMVar1->job).m_clientId.m_size = 0;
  (pMVar1->job).m_extraNonce.m_data = (char *)0x0;
  (pMVar1->job).m_extraNonce.m_size = 0;
  (pMVar1->job).m_id.m_data = (char *)0x0;
  (pMVar1->job).m_id.m_size = 0;
  (pMVar1->job).m_poolWallet.m_data = (char *)0x0;
  *(undefined8 *)((long)&(pMVar1->job).m_poolWallet.m_data + 4) = 0;
  *(undefined8 *)((long)&(pMVar1->job).m_poolWallet.m_size + 4) = 0;
  memset(&(pMVar1->job).m_diff,0,0x99);
  (pMVar1->backends).super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pMVar1->backends).super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pMVar1->backends).super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pMVar1->userJobId).m_data = (char *)0x0;
  (pMVar1->userJobId).m_size = 0;
  pMVar1->timer = (Timer *)0x0;
  pMVar1->ticks = 0;
  this->d_ptr = pMVar1;
  Base::addListener(&controller->super_Base,&this->super_IBaseListener);
  this_00 = Base::api(&controller->super_Base);
  Api::addListener(this_00,&this->super_IApiListener);
  this_01 = (Timer *)operator_new(0x10);
  Timer::Timer(this_01,&this->super_ITimerListener);
  pMVar1 = this->d_ptr;
  pMVar1->timer = this_01;
  std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>::reserve(&pMVar1->backends,3);
  pMVar1 = this->d_ptr;
  pOVar2 = (OclBackend *)operator_new(0x10);
  CpuBackend::CpuBackend((CpuBackend *)pOVar2,controller);
  local_30 = pOVar2;
  std::vector<xmrig::IBackend*,std::allocator<xmrig::IBackend*>>::emplace_back<xmrig::IBackend*>
            ((vector<xmrig::IBackend*,std::allocator<xmrig::IBackend*>> *)&pMVar1->backends,
             (IBackend **)&local_30);
  pMVar1 = this->d_ptr;
  pOVar2 = (OclBackend *)operator_new(0x10);
  OclBackend::OclBackend(pOVar2,controller);
  local_30 = pOVar2;
  std::vector<xmrig::IBackend*,std::allocator<xmrig::IBackend*>>::emplace_back<xmrig::IBackend*>
            ((vector<xmrig::IBackend*,std::allocator<xmrig::IBackend*>> *)&pMVar1->backends,
             (IBackend **)&local_30);
  pMVar1 = this->d_ptr;
  pOVar2 = (OclBackend *)operator_new(0x10);
  CudaBackend::CudaBackend((CudaBackend *)pOVar2,controller);
  local_30 = pOVar2;
  std::vector<xmrig::IBackend*,std::allocator<xmrig::IBackend*>>::emplace_back<xmrig::IBackend*>
            ((vector<xmrig::IBackend*,std::allocator<xmrig::IBackend*>> *)&pMVar1->backends,
             (IBackend **)&local_30);
  return;
}

Assistant:

xmrig::Miner::Miner(Controller *controller)
    : d_ptr(new MinerPrivate(controller))
{
    controller->addListener(this);

#   ifdef XMRIG_FEATURE_API
    controller->api()->addListener(this);
#   endif

    d_ptr->timer = new Timer(this);

    d_ptr->backends.reserve(3);
    d_ptr->backends.push_back(new CpuBackend(controller));

#   ifdef XMRIG_FEATURE_OPENCL
    d_ptr->backends.push_back(new OclBackend(controller));
#   endif

#   ifdef XMRIG_FEATURE_CUDA
    d_ptr->backends.push_back(new CudaBackend(controller));
#   endif
}